

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayoutitem.cpp
# Opt level: O2

bool __thiscall QWidgetItem::isEmpty(QWidgetItem *this)

{
  QSizePolicy QVar1;
  QWidgetData *pQVar2;
  
  pQVar2 = this->wid->data;
  if ((pQVar2->widget_attributes & 0x10000) != 0) {
    QVar1 = QWidget::sizePolicy(this->wid);
    if (-1 < (int)QVar1.field_0) {
      return true;
    }
    pQVar2 = this->wid->data;
  }
  return (bool)((byte)(pQVar2->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                      super_QFlagsStorage<Qt::WindowType>.i & 1);
}

Assistant:

bool QWidgetItem::isEmpty() const
{
    return (wid->isHidden() && !wid->sizePolicy().retainSizeWhenHidden()) || wid->isWindow();
}